

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<Date>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  iterator iVar4;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 local_38;
  undefined4 local_30;
  
  local_68 = 0x2000000000;
  uStack_60 = 0xffffffff00000000;
  local_58 = 0;
  local_50 = 0;
  local_48 = 0;
  local_38 = 0;
  local_30 = 0;
  pcVar3 = formatter<fmt::v5::basic_string_view<char>,char,void>::
           parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
                     ((formatter<fmt::v5::basic_string_view<char>,char,void> *)&local_68,
                      (basic_parse_context<char,_fmt::v5::internal::error_handler> *)ctx);
  pcVar2 = (ctx->
           super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ).parse_context_.format_str_.data_;
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).parse_context_.format_str_.data_ = pcVar3;
  psVar1 = &(ctx->
            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
            ).parse_context_.format_str_.size_;
  *psVar1 = (size_t)(pcVar2 + (*psVar1 - (long)pcVar3));
  iVar4 = formatter<Date,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<Date,char,void> *)&local_68,(Date *)arg,ctx);
  (ctx->
  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ).out_.container = iVar4.container;
  return;
}

Assistant:

void operator=(const basic_format_context &) = delete;